

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_residual.c
# Opt level: O2

int h264_residual_luma(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,
                      h264_macroblock *mb,int start,int end,int which)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  int32_t (*paaiVar6) [16] [15];
  int32_t (*block) [4] [64];
  long lVar7;
  ulong uVar8;
  long lVar9;
  int32_t (*paaiVar10) [16] [16];
  bool bVar11;
  int32_t tmp [16];
  
  lVar7 = (long)which;
  if ((start == 0) && (0xffffffe7 < mb->mb_type - 0x19)) {
    iVar5 = h264_residual_block(str,cabac,slice,mb,mb->block_luma_dc[lVar7],(int *)0x0,
                                h264_residual_luma::cattab[lVar7][0],0,0,0xf,0x10,1);
    if (iVar5 != 0) {
      return 1;
    }
  }
  else {
    mb->coded_block_flag[lVar7][0x10] = 0;
  }
  iVar5 = start + -1;
  if (start == 0) {
    iVar5 = 0;
  }
  bVar11 = mb->mb_type - 1 < 0x18;
  if (!bVar11) {
    iVar5 = start;
  }
  if ((cabac == (h264_cabac_context *)0x0) || (mb->transform_size_8x8_flag == 0)) {
    uVar1 = (uint)bVar11;
    paaiVar6 = mb->block_luma_ac + lVar7;
    paaiVar10 = mb->block_luma_4x4 + lVar7;
    for (uVar8 = 0; uVar8 != 0x10; uVar8 = uVar8 + 1) {
      uVar4 = (ulong)((uint)uVar8 & 3);
      if (mb->transform_size_8x8_flag == 0) {
        if (mb->mb_type - 0x19 < 0xffffffe8) {
          for (lVar9 = 0; piVar3 = h264_residual_luma::cattab[lVar7] + 2, lVar9 != 0x10;
              lVar9 = lVar9 + 1) {
            tmp[lVar9] = (*paaiVar10)[0][lVar9];
          }
        }
        else {
          for (lVar9 = 0; piVar3 = h264_residual_luma::cattab[lVar7] + 1, lVar9 != 0xf;
              lVar9 = lVar9 + 1) {
            tmp[lVar9] = (*paaiVar6)[0][lVar9];
          }
        }
      }
      else {
        for (lVar9 = 0; piVar3 = h264_residual_luma::cattab[lVar7] + 3, lVar9 != 0x40;
            lVar9 = lVar9 + 4) {
          *(int32_t *)((long)tmp + lVar9) =
               mb->block_luma_8x8[lVar7][0][uVar4 + (uVar8 & 0xfffffffffffffffc) * 0x10 + lVar9];
        }
      }
      iVar2 = h264_residual_block(str,cabac,slice,mb,tmp,mb->total_coeff[lVar7] + uVar8,*piVar3,
                                  (uint)uVar8,iVar5,end - uVar1,0x10 - uVar1,
                                  (uint)((mb->coded_block_pattern >> ((uint)(uVar8 >> 2) & 0x1f) & 1
                                         ) != 0));
      if (iVar2 != 0) goto LAB_00107a7f;
      if (mb->transform_size_8x8_flag == 0) {
        if (mb->mb_type - 0x19 < 0xffffffe8) {
          for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
            (*paaiVar10)[0][lVar9] = tmp[lVar9];
          }
        }
        else {
          for (lVar9 = 0; lVar9 != 0xf; lVar9 = lVar9 + 1) {
            (*paaiVar6)[0][lVar9] = tmp[lVar9];
          }
        }
      }
      else {
        for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 4) {
          mb->block_luma_8x8[lVar7][0][uVar4 + (uVar8 & 0xfffffffffffffffc) * 0x10 + lVar9] =
               *(int32_t *)((long)tmp + lVar9);
        }
      }
      paaiVar6 = (int32_t (*) [16] [15])(*paaiVar6 + 1);
      paaiVar10 = (int32_t (*) [16] [16])(*paaiVar10 + 1);
    }
LAB_00107c5c:
    iVar5 = 0;
  }
  else {
    block = mb->block_luma_8x8 + lVar7;
    lVar9 = 0;
    do {
      if (lVar9 == 4) goto LAB_00107c5c;
      iVar5 = h264_residual_block(str,cabac,slice,mb,(int32_t *)block,(int *)0x0,
                                  h264_residual_luma::cattab[lVar7][3],(uint)lVar9,start << 2,
                                  end * 4 + 3,0x40,
                                  (uint)((mb->coded_block_pattern >> ((uint)lVar9 & 0x1f) & 1) != 0)
                                 );
      lVar9 = lVar9 + 1;
      block = (int32_t (*) [4] [64])(*block + 1);
    } while (iVar5 == 0);
LAB_00107a7f:
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int h264_residual_luma(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb, int start, int end, int which) {
	static const int cattab[3][4] = {
		{ H264_CTXBLOCKCAT_LUMA_DC, H264_CTXBLOCKCAT_LUMA_AC, H264_CTXBLOCKCAT_LUMA_4X4, H264_CTXBLOCKCAT_LUMA_8X8 }, 
		{ H264_CTXBLOCKCAT_CB_DC, H264_CTXBLOCKCAT_CB_AC, H264_CTXBLOCKCAT_CB_4X4, H264_CTXBLOCKCAT_CB_8X8 }, 
		{ H264_CTXBLOCKCAT_CR_DC, H264_CTXBLOCKCAT_CR_AC, H264_CTXBLOCKCAT_CR_4X4, H264_CTXBLOCKCAT_CR_8X8 }, 
	};
	if (start == 0 && h264_is_intra_16x16_mb_type(mb->mb_type)) {
		if (h264_residual_block(str, cabac, slice, mb, mb->block_luma_dc[which], 0, cattab[which][0], 0, 0, 15, 16, 1)) return 1;
	} else {
		mb->coded_block_flag[which][16] = 0;
	}
	int i, j;
	int n = (h264_is_intra_16x16_mb_type(mb->mb_type) ? 15 : 16);
	int ss = (h264_is_intra_16x16_mb_type(mb->mb_type) ? (start?start-1:0) : start);
	int se = (h264_is_intra_16x16_mb_type(mb->mb_type) ? end - 1 : end);
	if (!mb->transform_size_8x8_flag || !cabac) {
		for (i = 0; i < 16; i++) {
			int32_t tmp[16];
			int cat;
			if (mb->transform_size_8x8_flag) {
				for (j = 0; j < 16; j++)
					tmp[j] = mb->block_luma_8x8[which][i >> 2][4 * j + (i & 3)];
				cat = cattab[which][3];
			} else if (h264_is_intra_16x16_mb_type(mb->mb_type)) {
				for (j = 0; j < 15; j++)
					tmp[j] = mb->block_luma_ac[which][i][j];
				cat = cattab[which][1];
			} else {
				for (j = 0; j < 16; j++)
					tmp[j] = mb->block_luma_4x4[which][i][j];
				cat = cattab[which][2];
			}
			if (h264_residual_block(str, cabac, slice, mb, tmp, &mb->total_coeff[which][i], cat, i, ss, se, n, mb->coded_block_pattern >> (i >> 2) & 1)) return 1;
			if (mb->transform_size_8x8_flag) {
				for (j = 0; j < 16; j++)
					mb->block_luma_8x8[which][i >> 2][4 * j + (i & 3)] = tmp[j];
			} else if (h264_is_intra_16x16_mb_type(mb->mb_type)) {
				for (j = 0; j < 15; j++)
					mb->block_luma_ac[which][i][j] = tmp[j];
			} else {
				for (j = 0; j < 16; j++)
					mb->block_luma_4x4[which][i][j] = tmp[j];
			}
		}
	} else {
		for (i = 0; i < 4; i++) {
			if (h264_residual_block(str, cabac, slice, mb, mb->block_luma_8x8[which][i], 0, cattab[which][3], i, 4*start, 4*end + 3, 64, mb->coded_block_pattern >> i & 1)) return 1;
		}
	}
	return 0;
}